

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall CConnman::ProcessAddrFetch(CConnman *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  ServiceFlags SVar1;
  bool bVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock71;
  string strDest;
  CSemaphoreGrant local_88;
  direct_or_indirect local_78;
  uint local_68;
  undefined8 local_50;
  undefined8 local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_78.indirect_contents.indirect = (char *)&this->m_addr_fetches_mutex;
  local_78.direct[8] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_78.indirect_contents);
  __str = (this->m_addr_fetches).
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->m_addr_fetches).
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == __str) {
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)&local_78.indirect_contents);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_40,__str);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&this->m_addr_fetches);
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)&local_78.indirect_contents);
    SVar1 = this->nLocalServices;
    CService::CService((CService *)&local_78.indirect_contents);
    local_50 = 100000000;
    local_48 = 0;
    local_88.sem = (this->semOutbound)._M_t.
                   super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>._M_t.
                   super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
                   super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl;
    bVar2 = CSemaphore::try_wait(local_88.sem);
    if (bVar2) {
      local_88.fHaveGrant = true;
      OpenNetworkConnection
                (this,(CAddress *)&local_78.indirect_contents,false,&local_88,
                 local_40._M_dataplus._M_p,ADDR_FETCH,(bool)((byte)(SVar1 >> 0xb) & 1));
      if ((local_88.fHaveGrant & 1U) != 0) {
        CSemaphore::post(local_88.sem);
      }
    }
    if (0x10 < local_68) {
      free(local_78.indirect_contents.indirect);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::ProcessAddrFetch()
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    std::string strDest;
    {
        LOCK(m_addr_fetches_mutex);
        if (m_addr_fetches.empty())
            return;
        strDest = m_addr_fetches.front();
        m_addr_fetches.pop_front();
    }
    // Attempt v2 connection if we support v2 - we'll reconnect with v1 if our
    // peer doesn't support it or immediately disconnects us for another reason.
    const bool use_v2transport(GetLocalServices() & NODE_P2P_V2);
    CAddress addr;
    CSemaphoreGrant grant(*semOutbound, /*fTry=*/true);
    if (grant) {
        OpenNetworkConnection(addr, false, std::move(grant), strDest.c_str(), ConnectionType::ADDR_FETCH, use_v2transport);
    }
}